

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# local_storage.cpp
# Opt level: O3

void __thiscall
duckdb::LocalStorage::MoveStorage(LocalStorage *this,DataTable *old_dt,DataTable *new_dt)

{
  LocalTableStorage *pLVar1;
  shared_ptr<duckdb::LocalTableStorage,_true> new_storage;
  undefined1 local_38 [32];
  
  LocalTableManager::MoveEntry((LocalTableManager *)local_38,(DataTable *)&this->table_manager);
  if (local_38._0_8_ != 0) {
    pLVar1 = shared_ptr<duckdb::LocalTableStorage,_true>::operator->
                       ((shared_ptr<duckdb::LocalTableStorage,_true> *)local_38);
    (pLVar1->table_ref)._M_data = new_dt;
    local_38._16_8_ = local_38._0_8_;
    local_38._24_8_ = local_38._8_8_;
    local_38._0_8_ = 0;
    local_38._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    LocalTableManager::InsertEntry
              (&this->table_manager,new_dt,
               (shared_ptr<duckdb::LocalTableStorage,_true> *)(local_38 + 0x10));
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_38._24_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_38._24_8_);
    }
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_38._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_38._8_8_);
  }
  return;
}

Assistant:

void LocalStorage::MoveStorage(DataTable &old_dt, DataTable &new_dt) {
	// check if there are any pending appends for the old version of the table
	auto new_storage = table_manager.MoveEntry(old_dt);
	if (!new_storage) {
		return;
	}
	// take over the storage from the old entry
	new_storage->table_ref = new_dt;
	table_manager.InsertEntry(new_dt, std::move(new_storage));
}